

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

int fdb_validate_files(size_t num_filenames,char **filenames)

{
  fdb_file_handle *fhandle_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  fdb_status fVar4;
  long lVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  string str;
  string suffix;
  fdb_file_handle *fhandle;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_filenames;
  fdb_config config;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  char *local_278 [2];
  char local_268 [16];
  fdb_file_handle *local_258;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  undefined1 local_220 [8];
  _Alloc_hider local_218;
  char local_208 [224];
  fdb_config local_128;
  
  iVar2 = -1;
  if (filenames != (char **)0x0 && num_filenames != 0) {
    local_250._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_250._M_impl.super__Rb_tree_header._M_header;
    local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sVar7 = 0;
    local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_250._M_impl.super__Rb_tree_header._M_header._M_right =
         local_250._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::string((string *)&local_298,filenames[sVar7],(allocator *)local_220);
      lVar5 = std::__cxx11::string::rfind((char *)&local_298,0x148ac4,0xffffffffffffffff);
      if (lVar5 == -1) {
LAB_0012e955:
        if (local_298 != local_288) {
          operator_delete(local_298);
        }
        iVar2 = -1;
        goto LAB_0012e96e;
      }
      std::__cxx11::string::substr((ulong)local_278,(ulong)&local_298);
      iVar2 = atoi(local_278[0]);
      if ((iVar2 == 0) && (iVar3 = std::__cxx11::string::compare((char *)local_278), iVar3 != 0)) {
        if (local_278[0] != local_268) {
          operator_delete(local_278[0]);
        }
        goto LAB_0012e955;
      }
      local_220._0_4_ = iVar2;
      local_218._M_p = local_208;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_298,local_298 + local_290);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&local_250,
                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_220);
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0]);
      }
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      sVar7 = sVar7 + 1;
    } while (num_filenames != sVar7);
    get_default_config();
    memcpy(&local_128,local_220,0xf8);
    iVar3 = 0;
    if ((_Rb_tree_header *)local_250._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_250._M_impl.super__Rb_tree_header) {
      p_Var6 = local_250._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        fVar4 = fdb_open(&local_258,(char *)p_Var6[1]._M_parent,&local_128);
        fhandle_00 = local_258;
        if (fVar4 == FDB_RESULT_SUCCESS) {
          bVar1 = filemgr_is_successfully_compacted(local_258->root->file);
          if ((!bVar1) &&
             (iVar2 = strcmp(fhandle_00->root->file->filename,(char *)p_Var6[1]._M_parent),
             iVar2 == 0)) {
            fdb_close(fhandle_00);
            goto LAB_0012e8cf;
          }
          fdb_close(fhandle_00);
          iVar3 = iVar3 + 1;
          bVar1 = true;
        }
        else {
          iVar3 = iVar3 + -1;
LAB_0012e8cf:
          bVar1 = false;
        }
      } while ((bVar1) &&
              (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6),
              (_Rb_tree_header *)p_Var6 != &local_250._M_impl.super__Rb_tree_header));
    }
    iVar2 = (int)num_filenames + -1;
    if (iVar3 < (int)num_filenames) {
      iVar2 = iVar3;
    }
LAB_0012e96e:
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_250);
  }
  return iVar2;
}

Assistant:

LIBFDB_API
int fdb_validate_files(const size_t num_filenames,
                       const char** filenames) {
    fdb_status s;
    fdb_file_handle* fhandle;
    fdb_config config;

    if (!num_filenames || !filenames) {
        // Invalid arguments
        return -1;
    }

    // File name should be XXX.0, XXX.1, XXX.2, ...
    // Otherwise, it will result in undefined behavior.
    std::map<int, std::string> sorted_filenames;
    for (size_t i=0; i<num_filenames; ++i) {
        std::string str(filenames[i]);
        size_t last_dot_pos = str.rfind(".");
        if (last_dot_pos == std::string::npos) {
            // Invalid filename.
            return -1;
        }
        std::string suffix = str.substr(last_dot_pos+1);
        int compaction_no = atoi(suffix.c_str());
        if (compaction_no == 0 && suffix != "0") {
            // This means that suffix doesn't contain compaction number.
            return -1;
        }
        sorted_filenames.insert( std::make_pair(compaction_no, str) );
    }

    config = fdb_get_default_config();
    // Note: READ_ONLY flag prevents compaction recovery,
    //       so we open FDB file without it.

    int valid_file_number = 0;
    for (auto& entry: sorted_filenames) {
        s = fdb_open(&fhandle, entry.second.c_str(), &config);
        if (s != FDB_RESULT_SUCCESS) {
            // Broken file, previous file is the last valid one.
            valid_file_number--;
            break;
        }
        if (filemgr_is_successfully_compacted(fhandle->root->file) ||
            strcmp(fhandle->root->file->filename, entry.second.c_str())) {
            // 1) 'successfully_compacted' flag support version:
            //    -> just check flag
            // 2) Otherwise: if opened file name is different
            //    to original -> this implies that compaction succeeded.
            valid_file_number++;
            s = fdb_close(fhandle);
        } else {
            s = fdb_close(fhandle);
            break;
        }
    }

    if (valid_file_number >= (int)num_filenames) {
        // All files are valid.
        // Return the last index number.
        valid_file_number = num_filenames - 1;
    }

    return valid_file_number;
}